

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_collection_size_test.cc
# Opt level: O2

int main(void)

{
  pointer pNVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  pointer pNVar6;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  trees_collection;
  string file_path;
  Node<label::StringLabel> t;
  BracketNotationParser<label::StringLabel> bnp;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_path,"parser_collection_size_test_data.txt",(allocator<char> *)&bnp);
  trees_collection.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trees_collection.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trees_collection.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&bnp);
  parser::BracketNotationParser<label::StringLabel>::parse_collection
            (&bnp,&trees_collection,&file_path);
  pNVar1 = trees_collection.
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)trees_collection.
                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)trees_collection.
                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (pNVar6 = trees_collection.
                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar1; pNVar6 = pNVar6 + 1) {
    node::Node<label::StringLabel>::Node(&t,pNVar6);
    iVar2 = node::Node<label::StringLabel>::get_tree_size(&t);
    iVar5 = iVar5 + iVar2;
    node::Node<label::StringLabel>::~Node(&t);
  }
  iVar2 = (int)(lVar3 / 0x38);
  if (iVar2 == 3) {
    iVar2 = 0;
    if (iVar5 == 0x22) goto LAB_00102505;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect number of nodes in collection: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    poVar4 = std::operator<<(poVar4," instead of ");
    iVar5 = 0x22;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Incorrect number of trees in collection: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," instead of ");
    iVar5 = 3;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar2 = -1;
LAB_00102505:
  parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&bnp);
  std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
  ~vector(&trees_collection);
  std::__cxx11::string::~string((string *)&file_path);
  return iVar2;
}

Assistant:

int main() {
  using Label = label::StringLabel;

  // Correct result - currently hard-coded here.
  int correct_number_trees = 3;
  int correct_number_nodes = 1 + 13 + 20;

  std::string file_path = "parser_collection_size_test_data.txt";

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;

  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, file_path);

  int computed_number_trees = trees_collection.size();
  int computed_number_nodes = 0;
  for (auto t : trees_collection) {
    computed_number_nodes += t.get_tree_size();
  }

  if (correct_number_trees != computed_number_trees) {
    std::cerr << "Incorrect number of trees in collection: " << computed_number_trees << " instead of " << correct_number_trees << std::endl;
    return -1;
  }

  if (correct_number_nodes != computed_number_nodes) {
    std::cerr << "Incorrect number of nodes in collection: " << computed_number_nodes << " instead of " << correct_number_nodes << std::endl;
    return -1;
  }

  return 0;
}